

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<char[4],fmt::v5::basic_string_view<char>>
          (char *expected_expression,char *actual_expression,char (*expected) [4],
          basic_string_view<char> *actual)

{
  basic_string_view<char> rhs;
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  basic_string_view<char> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string_view<char> *in_RDI;
  char *in_R8;
  AssertionResult AVar5;
  char *in_stack_ffffffffffffff48;
  basic_string_view<char> *in_stack_ffffffffffffff50;
  basic_string_view<char> *pbVar6;
  basic_string_view<char> in_stack_ffffffffffffff68;
  string local_88 [32];
  string local_68 [39];
  string *actual_value;
  string *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  
  pbVar6 = in_RDI;
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  unique0x00012000 = *(undefined8 *)in_R8;
  actual_value = *(string **)(in_R8 + 8);
  rhs.size_ = (size_t)pbVar6;
  rhs.data_ = (char *)in_RDI;
  bVar3 = fmt::v5::operator==(in_stack_ffffffffffffff68,rhs);
  if (bVar3) {
    AVar5 = AssertionSuccess();
    sVar4 = AVar5.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<char[4],fmt::v5::basic_string_view<char>>
              ((char (*) [4])in_RDI,in_RDX);
    FormatForComparisonFailureMessage<fmt::v5::basic_string_view<char>,char[4]>
              (in_RDI,(char (*) [4])in_RDX);
    uVar2 = stack0xffffffffffffffb8;
    uVar1 = (ulong)stack0xffffffffffffffb8 >> 0x38;
    bVar3 = SUB81(uVar1,0);
    unique0x1000017d = uVar2;
    EqFailure(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,actual_value,bVar3);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    sVar4.ptr_ = extraout_RDX;
  }
  AVar5.message_.ptr_ = sVar4.ptr_;
  AVar5._0_8_ = pbVar6;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}